

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O0

void __thiscall PcodeGenerator::InlineReplace(PcodeGenerator *this)

{
  FILE *__stream;
  bool bVar1;
  __type _Var2;
  PcodeType PVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pPVar6;
  const_iterator local_148;
  Pcode *local_140;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_138;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_130;
  iterator iter_2;
  int local_11c;
  const_iterator local_118;
  Pcode *local_110;
  const_iterator local_108;
  Pcode *local_100;
  PcodeType local_f4;
  undefined1 local_f0 [4];
  PcodeType op_1;
  string num1;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_c8;
  iterator iter_1;
  string num3;
  iterator iStack_98;
  PcodeType op;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_90;
  iterator iter;
  undefined1 local_80 [4];
  int argument_number;
  string func_name;
  undefined1 local_50 [8];
  string bottom_label;
  string top_label;
  PcodeGenerator *this_local;
  
  FunctionTable::ZeroCurrentTermPtr(handle_func_table);
  std::__cxx11::string::string((string *)(bottom_label.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  do {
    bVar1 = FunctionTable::GetFuncLabel
                      (handle_func_table,(string *)((long)&bottom_label.field_2 + 8),
                       (string *)local_50);
    if (!bVar1) {
      local_130._M_current =
           (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
      while( true ) {
        local_138._M_current =
             (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::end(&this->m_pcode_queue);
        bVar1 = __gnu_cxx::operator!=(&local_130,&local_138);
        if (!bVar1) break;
        pPVar6 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_130);
        PVar3 = Pcode::GetOP(pPVar6);
        if (PVar3 == NOP) {
          __gnu_cxx::__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>>::
          __normal_iterator<Pcode*>
                    ((__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>> *)
                     &local_148,&local_130);
          local_140 = (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::erase
                                         (&this->m_pcode_queue,local_148);
          local_130._M_current = local_140;
        }
        __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
        operator++(&local_130);
      }
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string((string *)(bottom_label.field_2._M_local_buf + 8));
      return;
    }
    bVar1 = CanInline(this,(string *)((long)&bottom_label.field_2 + 8),(string *)local_50);
    __stream = _stdout;
    if (bVar1) {
      uVar4 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::c_str();
      fprintf(__stream,"can inline label:%s---%s\n",uVar4,uVar5);
      std::__cxx11::string::string((string *)local_80);
      FunctionTable::GetCurrentTermName(handle_func_table,(string *)local_80);
      FunctionTable::GetCurrentTermArgumentNumber
                (handle_func_table,(int *)((long)&iter._M_current + 4));
      local_90._M_current =
           (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
      while( true ) {
        iStack_98 = std::vector<Pcode,_std::allocator<Pcode>_>::end(&this->m_pcode_queue);
        bVar1 = __gnu_cxx::operator!=(&local_90,&stack0xffffffffffffff68);
        if (!bVar1) break;
        pPVar6 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_90);
        PVar3 = Pcode::GetOP(pPVar6);
        if (PVar3 == CALL) {
          pPVar6 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&local_90);
          Pcode::GetNum3_abi_cxx11_((string *)&iter_1,pPVar6);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&iter_1,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80);
          if (_Var2) {
            CallReplace(this,&local_90,(string *)((long)&bottom_label.field_2 + 8),
                        (string *)local_50,iter._M_current._4_4_);
          }
          std::__cxx11::string::~string((string *)&iter_1);
        }
        __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
        operator++(&local_90);
      }
      local_c8._M_current =
           (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
      do {
        num1.field_2._8_8_ = std::vector<Pcode,_std::allocator<Pcode>_>::end(&this->m_pcode_queue);
        bVar1 = __gnu_cxx::operator!=
                          (&local_c8,
                           (__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                            *)((long)&num1.field_2 + 8));
        if (!bVar1) break;
        pPVar6 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_c8);
        Pcode::GetNum1_abi_cxx11_((string *)local_f0,pPVar6);
        pPVar6 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_c8);
        local_f4 = Pcode::GetOP(pPVar6);
        if ((local_f4 == LABEL) &&
           (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_f0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&bottom_label.field_2 + 8)), _Var2)) {
          do {
            __gnu_cxx::__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>>::
            __normal_iterator<Pcode*>
                      ((__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>> *)
                       &local_108,&local_c8);
            local_100 = (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::erase
                                           (&this->m_pcode_queue,local_108);
            local_c8._M_current = local_100;
            pPVar6 = __gnu_cxx::
                     __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                     operator->(&local_c8);
            local_f4 = Pcode::GetOP(pPVar6);
          } while (local_f4 != FUNC_BOTTOM);
          __gnu_cxx::__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>>::
          __normal_iterator<Pcode*>
                    ((__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>> *)
                     &local_118,&local_c8);
          local_110 = (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::erase
                                         (&this->m_pcode_queue,local_118);
          local_11c = 7;
          local_c8._M_current = local_110;
        }
        else {
          iter_2._M_current =
               (Pcode *)__gnu_cxx::
                        __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                        operator++(&local_c8,0);
          local_11c = 0;
        }
        std::__cxx11::string::~string((string *)local_f0);
      } while (local_11c == 0);
      std::__cxx11::string::~string((string *)local_80);
    }
    FunctionTable::NextTerm(handle_func_table);
  } while( true );
}

Assistant:

void PcodeGenerator::InlineReplace() {
    handle_func_table->ZeroCurrentTermPtr();
    string top_label;
    string bottom_label;
    while (handle_func_table->GetFuncLabel(top_label, bottom_label)) {
        if (CanInline(top_label, bottom_label)){
            fprintf(stdout, "can inline label:%s---%s\n", top_label.c_str(), bottom_label.c_str());
            string func_name;
            handle_func_table->GetCurrentTermName(func_name);
            int argument_number;
            handle_func_table->GetCurrentTermArgumentNumber(argument_number);
            // replace func code
            for (auto iter=m_pcode_queue.begin(); iter!=m_pcode_queue.end(); ++iter) {
                PcodeType op = iter->GetOP();
                if (op == CALL) {
                    string num3 = iter->GetNum3();
                    if (num3 == func_name) {
                        CallReplace(iter, top_label, bottom_label, argument_number);
                    }
                }
            }
            // delete origin func
            for (auto iter=m_pcode_queue.begin(); iter != m_pcode_queue.end();) {
                string num1 = iter->GetNum1();
                PcodeType op = iter->GetOP();
                if (op == LABEL && num1 == top_label) {
                    do {
                        //fprintf(stdout, "erase---%s\n", iter->GetNum1().c_str());
                        iter = m_pcode_queue.erase(iter);
                        op = iter->GetOP();
                        //num1 = iter->GetNum1();
                    //} while (op != LABEL || num1 != bottom_label); 
                    } while (op != FUNC_BOTTOM);
                    iter = m_pcode_queue.erase(iter);
                    break;
                } else {
                    iter++;
                }
            }
        }
        handle_func_table->NextTerm();
    }
    for (auto iter = m_pcode_queue.begin(); iter != m_pcode_queue.end(); ++iter) {
        if (iter->GetOP() == NOP) {
            iter = m_pcode_queue.erase(iter);
        }
    }
}